

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::LookupLinkItems
          (cmGeneratorTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *names,cmListFileBacktrace *bt,vector<cmLinkItem,_std::allocator<cmLinkItem>_> *items)

{
  pointer pbVar1;
  int iVar2;
  pointer item;
  string name;
  string local_90;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *local_70;
  cmLinkItem local_68;
  
  item = (names->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (names->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (item != pbVar1) {
    local_70 = items;
    do {
      CheckCMP0004(&local_90,this,item);
      if (local_90._M_string_length == (this->Target->Name)._M_string_length) {
        if ((local_90._M_string_length != 0) &&
           (iVar2 = bcmp(local_90._M_dataplus._M_p,(this->Target->Name)._M_dataplus._M_p,
                         local_90._M_string_length), iVar2 != 0)) {
LAB_00394539:
          ResolveLinkItem(&local_68,this,&local_90,bt);
          std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                    (local_70,&local_68);
          if (local_68.Backtrace.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_68.Backtrace.TopEntry.
                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68.String._M_dataplus._M_p != &local_68.String.field_2) {
            operator_delete(local_68.String._M_dataplus._M_p,
                            local_68.String.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else if (local_90._M_string_length != 0) goto LAB_00394539;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      item = item + 1;
    } while (item != pbVar1);
  }
  return;
}

Assistant:

void cmGeneratorTarget::LookupLinkItems(std::vector<std::string> const& names,
                                        cmListFileBacktrace const& bt,
                                        std::vector<cmLinkItem>& items) const
{
  for (std::string const& n : names) {
    std::string name = this->CheckCMP0004(n);
    if (name == this->GetName() || name.empty()) {
      continue;
    }
    items.push_back(this->ResolveLinkItem(name, bt));
  }
}